

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_gal_tests.cc
# Opt level: O0

void __thiscall lf::uscalfe::test::lf_gfe_a_dir_dbg_4_Test::TestBody(lf_gfe_a_dir_dbg_4_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  char *message;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:126:7)>
  *in_R9;
  AssertHelper local_d8;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:126:7)>
  local_a8;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:123:7)>
  local_98;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:120:7)>
  local_88;
  undefined1 local_78 [8];
  vector<double,_std::allocator<double>_> en;
  undefined1 local_58 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:126:7)>
  gamma;
  undefined1 local_40 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:123:7)>
  alpha;
  undefined1 local_28 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:120:7)>
  v;
  int reflevels;
  lf_gfe_a_dir_dbg_4_Test *this_local;
  
  v._12_4_ = 6;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "#### TEST: Bilinear form test 4, linear reference function");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"alpha = 0, gamma = 1, => energy = 8/3 = 2.6666..")
  ;
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:120:7)>
  ::MeshFunctionGlobal();
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:123:7)>
  ::MeshFunctionGlobal();
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:126:7)>
  ::MeshFunctionGlobal();
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:120:7)>
  ::MeshFunctionGlobal
            (&local_88,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:120:7)>
              *)local_28);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:123:7)>
  ::MeshFunctionGlobal
            (&local_98,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:123:7)>
              *)local_40);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:126:7)>
  ::MeshFunctionGlobal
            (&local_a8,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:126:7)>
              *)local_58);
  LinFEEnergyTest<lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_gfe_a_dir_dbg_4_Test::TestBody()::__0>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_gfe_a_dir_dbg_4_Test::TestBody()::__1>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_gfe_a_dir_dbg_4_Test::TestBody()::__2>>
            ((vector<double,_std::allocator<double>_> *)local_78,(test *)0x6,(int)&local_88,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:120:7)>
              *)&local_98,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:123:7)>
              *)&local_a8,in_R9);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:126:7)>
  ::~MeshFunctionGlobal(&local_a8);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:123:7)>
  ::~MeshFunctionGlobal(&local_98);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:120:7)>
  ::~MeshFunctionGlobal(&local_88);
  pvVar3 = std::vector<double,_std::allocator<double>_>::back
                     ((vector<double,_std::allocator<double>_> *)local_78);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_c8,"en.back()","8.0 / 3.0","1.0E-4",*pvVar3,2.6666666666666665,0.0001
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc"
               ,0x81,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_78);
  return;
}

Assistant:

TEST(lf_gfe, a_dir_dbg_4) {
  // Four levels of refinement
  const int reflevels = REFLEV;
  std::cout << "#### TEST: Bilinear form test 4, linear reference function"
            << std::endl;
  std::cout << "alpha = 0, gamma = 1, => energy = 8/3 = 2.6666.." << std::endl;
  // Synthetic function
  auto v = mesh::utils::MeshFunctionGlobal(
      [](Eigen::Vector2d x) -> double { return (2.0 * x[0] + x[1]); });
  // Diffusion coefficient
  auto alpha = mesh::utils::MeshFunctionGlobal(
      [](Eigen::Vector2d x) -> double { return 0.0; });
  // Reaction coefficient
  auto gamma = mesh::utils::MeshFunctionGlobal(
      [](Eigen::Vector2d x) -> double { return 1.0; });

  auto en{LinFEEnergyTest(reflevels, v, alpha, gamma)};
  EXPECT_NEAR(en.back(), 8.0 / 3.0, 1.0E-4);
}